

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O2

void start_server(uv_loop_t *loop,uv_tcp_t *handle)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  sockaddr_in addr;
  undefined1 auStack_18 [16];
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_18);
  if (iVar1 == 0) {
    iVar1 = uv_tcp_init(loop,&tcp_server);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_bind(&tcp_server,auStack_18,0);
      if (iVar1 == 0) {
        iVar1 = uv_listen(&tcp_server,0x80,connection_cb);
        if (iVar1 == 0) {
          return;
        }
        pcVar3 = "r == 0";
        uVar2 = 0xa0;
      }
      else {
        pcVar3 = "r == 0";
        uVar2 = 0x9d;
      }
    }
    else {
      pcVar3 = "r == 0";
      uVar2 = 0x9a;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uVar2 = 0x97;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close-reset.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void start_server(uv_loop_t* loop, uv_tcp_t* handle) {
  struct sockaddr_in addr;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_tcp_init(loop, handle);
  ASSERT(r == 0);

  r = uv_tcp_bind(handle, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_listen((uv_stream_t*)handle, 128, connection_cb);
  ASSERT(r == 0);
}